

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O2

void __thiscall QAbstractItemViewPrivate::clearOrRemove(QAbstractItemViewPrivate *this)

{
  QModelIndex *pQVar1;
  QAbstractItemModel *pQVar2;
  int iVar3;
  int iVar4;
  undefined4 uVar5;
  iterator iVar6;
  iterator iVar7;
  int i;
  undefined1 *puVar8;
  QItemSelectionRange *pQVar9;
  long in_FS_OFFSET;
  QMap<int,_QVariant> roles;
  QMap<int,_QVariant> local_c0;
  undefined8 local_b8;
  quintptr qStack_b0;
  QAbstractItemModel *local_a8;
  QArrayDataPointer<QModelIndex> local_98;
  QArrayDataPointer<QItemSelectionRange> local_78;
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_78.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_78.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_78.ptr = (QItemSelectionRange *)&DAT_aaaaaaaaaaaaaaaa;
  QItemSelectionModel::selection();
  if (this->overwrite == false) {
    pQVar9 = local_78.ptr;
    while( true ) {
      if (pQVar9 == local_78.ptr + local_78.size) break;
      local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_58.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
      local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QPersistentModelIndex::parent();
      iVar3 = QPersistentModelIndex::column();
      if (iVar3 == 0) {
        iVar3 = QPersistentModelIndex::column();
        iVar4 = (**(code **)(*(long *)this->model + 0x80))(this->model,&local_58);
        if (iVar3 == iVar4 + -1) {
          iVar3 = QPersistentModelIndex::row();
          iVar4 = QPersistentModelIndex::row();
          pQVar2 = this->model;
          uVar5 = QPersistentModelIndex::row();
          (**(code **)(*(long *)pQVar2 + 0x108))(pQVar2,uVar5,(iVar3 - iVar4) + 1,&local_58);
        }
      }
      pQVar9 = pQVar9 + 1;
    }
  }
  else {
    local_98.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_98.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_98.ptr = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
    QItemSelection::indexes();
    for (puVar8 = (undefined1 *)0x0; puVar8 < (ulong)local_98.size; puVar8 = puVar8 + 1) {
      pQVar1 = local_98.ptr + (long)puVar8;
      local_b8._0_4_ = pQVar1->r;
      local_b8._4_4_ = pQVar1->c;
      qStack_b0 = pQVar1->i;
      local_a8 = local_98.ptr[(long)puVar8].m.ptr;
      local_c0.d.d.ptr =
           (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
            )&DAT_aaaaaaaaaaaaaaaa;
      (**(code **)(*(long *)this->model + 0xb0))(&local_c0,this->model,&local_b8);
      iVar6._M_node = (_Base_ptr)QMap<int,_QVariant>::begin(&local_c0);
      while( true ) {
        iVar7 = QMap<int,_QVariant>::end(&local_c0);
        if ((iterator)iVar6._M_node == iVar7.i._M_node) break;
        local_58._16_8_ = (undefined1 *)0x0;
        local_58.shared = (PrivateShared *)0x0;
        local_58._8_8_ = (undefined1 *)0x0;
        local_40 = 2;
        ::QVariant::operator=((QVariant *)&iVar6._M_node[1]._M_parent,(QVariant *)&local_58);
        ::QVariant::~QVariant((QVariant *)&local_58);
        iVar6._M_node = (_Base_ptr)std::_Rb_tree_increment(iVar6._M_node);
      }
      (**(code **)(*(long *)this->model + 0xb8))(this->model,&local_b8,&local_c0);
      QtPrivate::
      QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
      ::~QExplicitlySharedDataPointerV2(&local_c0.d);
    }
    QArrayDataPointer<QModelIndex>::~QArrayDataPointer(&local_98);
  }
  QArrayDataPointer<QItemSelectionRange>::~QArrayDataPointer(&local_78);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractItemViewPrivate::clearOrRemove()
{
#if QT_CONFIG(draganddrop)
    const QItemSelection selection = selectionModel->selection();
    QList<QItemSelectionRange>::const_iterator it = selection.constBegin();

    if (!overwrite) {
        for (; it != selection.constEnd(); ++it) {
            QModelIndex parent = (*it).parent();
            if ((*it).left() != 0)
                continue;
            if ((*it).right() != (model->columnCount(parent) - 1))
                continue;
            int count = (*it).bottom() - (*it).top() + 1;
            model->removeRows((*it).top(), count, parent);
        }
    } else {
        // we can't remove the rows so reset the items (i.e. the view is like a table)
        QModelIndexList list = selection.indexes();
        for (int i=0; i < list.size(); ++i) {
            QModelIndex index = list.at(i);
            QMap<int, QVariant> roles = model->itemData(index);
            for (QMap<int, QVariant>::Iterator it = roles.begin(); it != roles.end(); ++it)
                it.value() = QVariant();
            model->setItemData(index, roles);
        }
    }
#endif
}